

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase145::run(TestCase145 *this)

{
  bool bVar1;
  __pid_t __pid;
  Type local_2c8;
  bool local_2c1;
  Type local_2c0;
  DebugExpression<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1)>
  DStack_2bc;
  bool _kj_shouldLog_1;
  undefined1 local_2b8 [8];
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  _kjCondition_1;
  int local_288;
  DebugExpression<int> DStack_284;
  bool _kj_shouldLog;
  undefined1 local_280 [8];
  DebugComparison<int,_int_&> _kjCondition;
  SourceLocation local_250;
  undefined1 local_238 [16];
  siginfo_t info;
  WaitScope waitScope;
  undefined1 local_180 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase145 *this_local;
  
  if (((anonymous_namespace)::BROKEN_QEMU & 1) == 0) {
    captureSignals();
    UnixEventPort::UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
    EventLoop::EventLoop((EventLoop *)local_180,(EventPort *)&loop.currentlyFiring);
    WaitScope::WaitScope((WaitScope *)((long)&info._sifields + 0x68),(EventLoop *)local_180);
    __pid = getpid();
    kill(__pid,0x17);
    UnixEventPort::onSignal((UnixEventPort *)local_238,(int)&loop + 0x70);
    SourceLocation::SourceLocation
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x9b,0x14);
    Promise<siginfo_t>::wait((Promise<siginfo_t> *)(local_238 + 8),local_238);
    Promise<siginfo_t>::~Promise((Promise<siginfo_t> *)local_238);
    local_288 = 0x17;
    DStack_284 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_288);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_280,&stack0xfffffffffffffd7c,
               (int *)(local_238 + 8));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_280);
    if (!bVar1) {
      _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_1._39_1_ != '\0') {
        _kjCondition_1.result = true;
        _kjCondition_1._33_3_ = 0;
        kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x9c,ERROR,
                   "\"failed: expected \" \"(23) == (info.si_signo)\", _kjCondition, 23, info.si_signo"
                   ,(char (*) [41])"failed: expected (23) == (info.si_signo)",
                   (DebugComparison<int,_int_&> *)local_280,(int *)&_kjCondition_1.result,
                   (int *)(local_238 + 8));
        _kjCondition_1._39_1_ = 0;
      }
    }
    local_2c0 = SI_USER;
    DStack_2bc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2c0);
    kj::_::DebugExpression<$_11>::operator==
              ((DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
                *)local_2b8,(DebugExpression<__11> *)&stack0xfffffffffffffd44,&info.si_signo);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b8);
    if (!bVar1) {
      local_2c1 = kj::_::Debug::shouldLog(ERROR);
      while (local_2c1 != false) {
        local_2c8 = SI_USER;
        kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<__11,int&>&,__11,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x9d,ERROR,
                   "\"failed: expected \" \"(SI_USER) == (info.si_code)\", _kjCondition, SI_USER, info.si_code"
                   ,(char (*) [45])"failed: expected (SI_USER) == (info.si_code)",
                   (DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
                    *)local_2b8,&local_2c8,&info.si_signo);
        local_2c1 = false;
      }
    }
    WaitScope::~WaitScope((WaitScope *)((long)&info._sifields + 0x68));
    EventLoop::~EventLoop((EventLoop *)local_180);
    UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, Signals) {
  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}